

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a336a3::TransformNoSelector::~TransformNoSelector(TransformNoSelector *this)

{
  TransformSelector::~TransformSelector(&this->super_TransformSelector);
  operator_delete(this,0x28);
  return;
}

Assistant:

TransformNoSelector()
    : TransformSelector("NO SELECTOR")
  {
  }